

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O0

int cpolyroot(double *rcoeff,double *icoeff,int DEGREE,double *ZEROR,double *ZEROI)

{
  int iVar1;
  double *OPR_00;
  double *OPI_00;
  double *OPI;
  double *OPR;
  int local_38;
  int N;
  int i;
  int fail;
  double *ZEROI_local;
  double *ZEROR_local;
  int DEGREE_local;
  double *icoeff_local;
  double *rcoeff_local;
  
  iVar1 = DEGREE + 1;
  OPR_00 = (double *)malloc((long)iVar1 << 3);
  OPI_00 = (double *)malloc((long)iVar1 << 3);
  for (local_38 = 0; local_38 < iVar1; local_38 = local_38 + 1) {
    OPR_00[local_38] = rcoeff[DEGREE - local_38];
    OPI_00[local_38] = icoeff[DEGREE - local_38];
  }
  iVar1 = cpoly(OPR_00,OPI_00,DEGREE,ZEROR,ZEROI);
  free(OPR_00);
  free(OPI_00);
  return iVar1;
}

Assistant:

int cpolyroot(double *rcoeff,double *icoeff, int DEGREE, double *ZEROR, double *ZEROI) {
	/*
	Input - rcoeff[0]+i*icoeff[0] + (rcoeff[1] + i*icoeff[1]) * x^1 + (rcoeff[2] + i*icoeff[2]) * x^2 + ---- + (rcoeff[DEGREE+1] + i*icoeff[DEGREE+1]) * x^DEGREE

	The program fails if there are leading zeros [At least one coefficient of the highest degree should be non-zero. Reduce degree by one if both are zero]. Check return value.

	Return Value = 0 -> Probable Success
	Return Value = 1 -> Likely Failure
	*/
	int fail, i, N;
	double *OPR, *OPI;

	N = DEGREE + 1;
	OPR = (double*)malloc(sizeof(double)* N);
	OPI = (double*)malloc(sizeof(double)* N);

	for (i = 0; i < N; ++i) {
		OPR[i] = rcoeff[N - 1 - i];
		OPI[i] = icoeff[N - 1 - i];
	}
	fail = cpoly(OPR, OPI, DEGREE, ZEROR, ZEROI);

	free(OPR);
	free(OPI);
	return fail;
}